

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool setFontSizeFromValue(Value *value,QFont *font,int *fontSizeAdjustment)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 *in_RDX;
  QFont *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  bool valid;
  bool valid_1;
  QString s;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QFont *in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  QMetaType *min;
  bool local_a2;
  bool local_a1;
  bool local_85;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 6) {
    local_a1 = true;
    uVar1 = QVariant::toInt((bool *)(in_RDI + 2));
    switch(uVar1) {
    case 6:
      *in_RDX = 0xffffffff;
      break;
    case 7:
      *in_RDX = 0;
      break;
    case 8:
      *in_RDX = 1;
      break;
    case 9:
      *in_RDX = 2;
      break;
    case 10:
      *in_RDX = 3;
      break;
    default:
      local_a1 = false;
    }
    local_85 = local_a1;
  }
  else if (*in_RDI == 3) {
    local_a2 = false;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toString();
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffef8,
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    uVar2 = QString::endsWith((QLatin1String *)&local_60,(CaseSensitivity)QVar3.m_size);
    if ((uVar2 & 1) == 0) {
      QVar3 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffef8,
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      uVar2 = QString::endsWith((QLatin1String *)&local_60,(CaseSensitivity)QVar3.m_size);
      if ((uVar2 & 1) != 0) {
        QString::chop((longlong)&local_60);
        QVariant::QVariant(&local_48,(QString *)&local_60);
        QVariant::operator=((QVariant *)in_stack_fffffffffffffef8,
                            (QVariant *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        QVariant::~QVariant(&local_48);
        min = (QMetaType *)(in_RDI + 2);
        QMetaType::fromType<double>();
        uVar2 = QVariant::convert(min);
        local_a2 = (uVar2 & 1) != 0;
        if (local_a2) {
          QVariant::toInt((bool *)(in_RDI + 2));
          qBound<int>((int *)min,(int *)in_RSI,
                      (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          QFont::setPixelSize(in_RSI,in_stack_fffffffffffffef4);
        }
      }
    }
    else {
      QString::chop((longlong)&local_60);
      QVariant::QVariant(&local_28,(QString *)&local_60);
      QVariant::operator=((QVariant *)in_stack_fffffffffffffef8,
                          (QVariant *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      QVariant::~QVariant(&local_28);
      QMetaType::fromType<double>();
      uVar2 = QVariant::convert((QMetaType *)(in_RDI + 2));
      local_a2 = (uVar2 & 1) != 0;
      if (local_a2) {
        QVariant::toReal((bool *)(in_RDI + 2));
        qBound<double>(in_stack_ffffffffffffff00,(double *)in_stack_fffffffffffffef8,
                       (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        QFont::setPointSizeF
                  (in_stack_fffffffffffffef8,
                   (qreal)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
    }
    local_85 = local_a2;
    QString::~QString((QString *)0xa32f18);
  }
  else {
    local_85 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_85;
}

Assistant:

static bool setFontSizeFromValue(QCss::Value value, QFont *font, int *fontSizeAdjustment)
{
    if (value.type == Value::KnownIdentifier) {
        bool valid = true;
        switch (value.variant.toInt()) {
            case Value_Small: *fontSizeAdjustment = -1; break;
            case Value_Medium: *fontSizeAdjustment = 0; break;
            case Value_Large: *fontSizeAdjustment = 1; break;
            case Value_XLarge: *fontSizeAdjustment = 2; break;
            case Value_XXLarge: *fontSizeAdjustment = 3; break;
            default: valid = false; break;
        }
        return valid;
    }
    if (value.type != Value::Length)
        return false;

    bool valid = false;
    QString s = value.variant.toString();
    if (s.endsWith("pt"_L1, Qt::CaseInsensitive)) {
        s.chop(2);
        value.variant = s;
        if (value.variant.convert(QMetaType::fromType<qreal>())) {
            font->setPointSizeF(qBound(qreal(0), value.variant.toReal(), qreal(1 << 24) - 1));
            valid = true;
        }
    } else if (s.endsWith("px"_L1, Qt::CaseInsensitive)) {
        s.chop(2);
        value.variant = s;
        if (value.variant.convert(QMetaType::fromType<qreal>())) {
            font->setPixelSize(qBound(0, value.variant.toInt(), (1 << 24) - 1));
            valid = true;
        }
    }
    return valid;
}